

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize_x86.cpp
# Opt level: O2

void ncnn::dequantize(int *intptr,float *ptr,Mat *scale_data,Mat *bias_data,int elemcount,
                     int elempack)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  undefined1 (*pauVar4) [32];
  undefined1 auVar5 [16];
  long lVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar9 [28];
  undefined1 auVar12 [32];
  
  pauVar4 = (undefined1 (*) [32])scale_data->data;
  fVar2 = *(float *)*pauVar4;
  auVar8._4_4_ = fVar2;
  auVar8._0_4_ = fVar2;
  auVar8._8_4_ = fVar2;
  auVar8._12_4_ = fVar2;
  auVar9._16_4_ = fVar2;
  auVar9._0_16_ = auVar8;
  auVar9._20_4_ = fVar2;
  auVar9._24_4_ = fVar2;
  if (1 < scale_data->w) {
    if (elempack == 4) {
      auVar8 = *(undefined1 (*) [16])*pauVar4;
      auVar10._16_16_ = auVar8;
      auVar10._0_16_ = auVar8;
      auVar9 = auVar10._0_28_;
    }
    else if (elempack == 8) {
      auVar9 = SUB3228(*pauVar4,0);
    }
  }
  iVar7 = elemcount * elempack;
  if (bias_data->w == 0) {
    for (lVar6 = 0; (int)lVar6 + 7 < iVar7; lVar6 = lVar6 + 8) {
      auVar10 = vcvtdq2ps_avx(*(undefined1 (*) [32])(intptr + lVar6));
      pfVar1 = ptr + lVar6;
      *pfVar1 = auVar9._0_4_ * auVar10._0_4_;
      pfVar1[1] = auVar9._4_4_ * auVar10._4_4_;
      pfVar1[2] = auVar9._8_4_ * auVar10._8_4_;
      pfVar1[3] = auVar9._12_4_ * auVar10._12_4_;
      pfVar1[4] = auVar9._16_4_ * auVar10._16_4_;
      pfVar1[5] = auVar9._20_4_ * auVar10._20_4_;
      pfVar1[6] = auVar9._24_4_ * auVar10._24_4_;
      pfVar1[7] = auVar10._28_4_;
    }
    for (; (int)lVar6 + 3 < iVar7; lVar6 = lVar6 + 4) {
      auVar11 = vcvtdq2ps_avx(*(undefined1 (*) [16])(intptr + lVar6));
      pfVar1 = ptr + lVar6;
      *pfVar1 = auVar8._0_4_ * auVar11._0_4_;
      pfVar1[1] = auVar8._4_4_ * auVar11._4_4_;
      pfVar1[2] = auVar8._8_4_ * auVar11._8_4_;
      pfVar1[3] = auVar8._12_4_ * auVar11._12_4_;
    }
    for (; (int)lVar6 < iVar7; lVar6 = lVar6 + 1) {
      ptr[lVar6] = fVar2 * (float)intptr[lVar6];
    }
  }
  else {
    pauVar4 = (undefined1 (*) [32])bias_data->data;
    fVar3 = *(float *)*pauVar4;
    auVar11._4_4_ = fVar3;
    auVar11._0_4_ = fVar3;
    auVar11._8_4_ = fVar3;
    auVar11._12_4_ = fVar3;
    auVar12._16_4_ = fVar3;
    auVar12._0_16_ = auVar11;
    auVar12._20_4_ = fVar3;
    auVar12._24_4_ = fVar3;
    auVar12._28_4_ = fVar3;
    if (1 < bias_data->w) {
      if (elempack == 4) {
        auVar11 = *(undefined1 (*) [16])*pauVar4;
        auVar12._16_16_ = auVar11;
        auVar12._0_16_ = auVar11;
      }
      else if (elempack == 8) {
        auVar12 = *pauVar4;
      }
    }
    for (lVar6 = 0; (int)lVar6 + 7 < iVar7; lVar6 = lVar6 + 8) {
      auVar10 = vcvtdq2ps_avx(*(undefined1 (*) [32])(intptr + lVar6));
      pfVar1 = ptr + lVar6;
      *pfVar1 = auVar9._0_4_ * auVar10._0_4_ + auVar12._0_4_;
      pfVar1[1] = auVar9._4_4_ * auVar10._4_4_ + auVar12._4_4_;
      pfVar1[2] = auVar9._8_4_ * auVar10._8_4_ + auVar12._8_4_;
      pfVar1[3] = auVar9._12_4_ * auVar10._12_4_ + auVar12._12_4_;
      pfVar1[4] = auVar9._16_4_ * auVar10._16_4_ + auVar12._16_4_;
      pfVar1[5] = auVar9._20_4_ * auVar10._20_4_ + auVar12._20_4_;
      pfVar1[6] = auVar9._24_4_ * auVar10._24_4_ + auVar12._24_4_;
      pfVar1[7] = auVar10._28_4_ + auVar12._28_4_;
    }
    for (; (int)lVar6 + 3 < iVar7; lVar6 = lVar6 + 4) {
      auVar5 = vcvtdq2ps_avx(*(undefined1 (*) [16])(intptr + lVar6));
      pfVar1 = ptr + lVar6;
      *pfVar1 = auVar8._0_4_ * auVar5._0_4_ + auVar11._0_4_;
      pfVar1[1] = auVar8._4_4_ * auVar5._4_4_ + auVar11._4_4_;
      pfVar1[2] = auVar8._8_4_ * auVar5._8_4_ + auVar11._8_4_;
      pfVar1[3] = auVar8._12_4_ * auVar5._12_4_ + auVar11._12_4_;
    }
    for (; (int)lVar6 < iVar7; lVar6 = lVar6 + 1) {
      ptr[lVar6] = fVar2 * (float)intptr[lVar6] + fVar3;
    }
  }
  return;
}

Assistant:

static void dequantize(const int* intptr, float* ptr, const Mat& scale_data, const Mat& bias_data, int elemcount, int elempack)
{
    const int scale_data_size = scale_data.w;
    const int bias_data_size = bias_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("dequantize %d %d   %d %d", scale_data_size, bias_data_size, elemcount, elempack);

    float scale = scale_data[0];
#if __SSE2__
    __m128 _scale = _mm_set1_ps(scale);
#if __AVX__
    __m256 _scale_avx = _mm256_set1_ps(scale);
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#endif // __AVX512F__
#endif // __AVX__
    if (scale_data_size > 1)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_avx512 = _mm512_loadu_ps((const float*)scale_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            _scale_avx = _mm256_loadu_ps((const float*)scale_data);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
        }
#endif // __AVX__
        if (elempack == 4)
        {
            _scale = _mm_loadu_ps((const float*)scale_data);
#if __AVX__
            _scale_avx = combine4x2_ps(_scale, _scale);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
#endif // __AVX__
        }
    }
#endif // __SSE2__

    if (bias_data_size == 0)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_mul_ps(_v, _scale_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_mul_ps(_v, _scale_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_mul_ps(_v, _scale);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale;
            intptr++;
            ptr++;
        }
    }
    else
    {
        float bias = bias_data[0];
#if __SSE2__
        __m128 _bias = _mm_set1_ps(bias);
#if __AVX__
        __m256 _bias_avx = _mm256_set1_ps(bias);
#if __AVX512F__
        __m512 _bias_avx512 = _mm512_set1_ps(bias);
#endif // __AVX512F__
#endif // __AVX__
        if (bias_data_size > 1)
        {
#if __AVX__
#if __AVX512F__
            if (elempack == 16)
            {
                _bias_avx512 = _mm512_loadu_ps((const float*)bias_data);
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
                _bias_avx = _mm256_loadu_ps((const float*)bias_data);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
            }
#endif // __AVX__
            if (elempack == 4)
            {
                _bias = _mm_loadu_ps((const float*)bias_data);
#if __AVX__
                _bias_avx = combine4x2_ps(_bias, _bias);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
#endif // __AVX__
            }
        }
#endif // __SSE2__

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_fmadd_ps(_v, _scale_avx512, _bias_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_comp_fmadd_ps(_v, _scale_avx, _bias_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_comp_fmadd_ps(_v, _scale, _bias);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale + bias;
            intptr++;
            ptr++;
        }
    }
}